

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ram_test.cc
# Opt level: O2

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  RamPutUserPolicyRequestType *this;
  HttpTestListener *this_00;
  undefined8 extraout_RAX;
  allocator<char> local_169;
  RamListUsersResponseType resp_5;
  string local_148 [32];
  string local_128;
  string local_108;
  RamAddUserResponseType resp;
  RamGetUserRequestType req_2;
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  RamAddUserRequestType req;
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  paVar1 = &req.user_name.field_2;
  req.user_name._M_string_length = 0;
  req.user_name.field_2._M_local_buf[0] = '\0';
  paVar2 = &req.comments.field_2;
  req.comments._M_string_length = 0;
  req.comments.field_2._M_local_buf[0] = '\0';
  req.user_name._M_dataplus._M_p = (pointer)paVar1;
  req.comments._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&req_2,"cn-hangzhou",(allocator<char> *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"my_appid",(allocator<char> *)&resp_5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"my_secret",&local_169);
  this = (RamPutUserPolicyRequestType *)aliyun::Ram::CreateRamClient(&req_2,local_148,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string((string *)&req_2);
  if (this == (RamPutUserPolicyRequestType *)0x0) {
    aliyun::RamAddUserRequestType::~RamAddUserRequestType(&req);
    req.user_name._M_string_length = 0;
    req.user_name.field_2._M_local_buf[0] = '\0';
    req.comments._M_string_length = 0;
    req.comments.field_2._M_local_buf[0] = '\0';
    req.user_name._M_dataplus._M_p = (pointer)paVar1;
    req.comments._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&req_2,"cn-hangzhou",(allocator<char> *)&local_108);
    std::__cxx11::string::string<std::allocator<char>>
              (local_148,"my_appid",(allocator<char> *)&resp_5);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"my_secret",&local_169);
    this = (RamPutUserPolicyRequestType *)aliyun::Ram::CreateRamClient(&req_2,local_148,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string((string *)&req_2);
    if (this == (RamPutUserPolicyRequestType *)0x0) {
      aliyun::RamDeleteUserPolicyRequestType::~RamDeleteUserPolicyRequestType
                ((RamDeleteUserPolicyRequestType *)&req);
      paVar3 = &req_2.user_name.field_2;
      req_2.user_name._M_string_length = 0;
      req.user_name._M_string_length = 0;
      req_2.user_name.field_2._M_local_buf[0] = '\0';
      req.user_name.field_2._M_local_buf[0] = '\0';
      req.comments._M_string_length = 0;
      req.comments.field_2._M_local_buf[0] = '\0';
      req_2.user_name._M_dataplus._M_p = (pointer)paVar3;
      req.user_name._M_dataplus._M_p = (pointer)paVar1;
      req.comments._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::string<std::allocator<char>>
                (local_148,"cn-hangzhou",(allocator<char> *)&resp_5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"my_appid",(allocator<char> *)&resp);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"my_secret",&local_169);
      this = (RamPutUserPolicyRequestType *)
             aliyun::Ram::CreateRamClient(local_148,&local_128,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string(local_148);
      if (this == (RamPutUserPolicyRequestType *)0x0) {
        aliyun::RamGetUserResponseType::~RamGetUserResponseType((RamGetUserResponseType *)&req);
        std::__cxx11::string::~string((string *)&req_2);
        req_2.user_name._M_string_length = 0;
        req_2.user_name.field_2._M_local_buf[0] = '\0';
        local_a8._M_p = (pointer)&local_98;
        local_a0 = 0;
        req.user_name._M_string_length = 0;
        req.user_name.field_2._M_local_buf[0] = '\0';
        req.comments._M_string_length = 0;
        local_98._M_local_buf[0] = '\0';
        req.comments.field_2._M_local_buf[0] = '\0';
        local_40 = 0;
        local_38._M_local_buf[0] = '\0';
        req_2.user_name._M_dataplus._M_p = (pointer)paVar3;
        req.user_name._M_dataplus._M_p = (pointer)paVar1;
        req.comments._M_dataplus._M_p = (pointer)paVar2;
        local_48._M_p = (pointer)&local_38;
        std::__cxx11::string::string<std::allocator<char>>
                  (local_148,"cn-hangzhou",(allocator<char> *)&resp_5);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"my_appid",(allocator<char> *)&resp);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"my_secret",&local_169);
        this = (RamPutUserPolicyRequestType *)
               aliyun::Ram::CreateRamClient(local_148,&local_128,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string(local_148);
        if (this == (RamPutUserPolicyRequestType *)0x0) {
          aliyun::RamGetUserPolicyResponseType::~RamGetUserPolicyResponseType
                    ((RamGetUserPolicyResponseType *)&req);
          aliyun::RamGetUserPolicyRequestType::~RamGetUserPolicyRequestType
                    ((RamGetUserPolicyRequestType *)&req_2);
          req.user_name._M_string_length = 0;
          req.user_name.field_2._M_local_buf[0] = '\0';
          _resp = (pointer)0x0;
          req.user_name._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&req_2,"cn-hangzhou",(allocator<char> *)&local_108);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_148,"my_appid",(allocator<char> *)&resp_5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_128,"my_secret",&local_169);
          this = (RamPutUserPolicyRequestType *)
                 aliyun::Ram::CreateRamClient(&req_2,local_148,&local_128);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string(local_148);
          std::__cxx11::string::~string((string *)&req_2);
          if (this == (RamPutUserPolicyRequestType *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&resp);
            std::__cxx11::string::~string((string *)&req);
            resp_5.users.
            super__Vector_base<aliyun::RamListUsersUserType,_std::allocator<aliyun::RamListUsersUserType>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            resp_5.users.
            super__Vector_base<aliyun::RamListUsersUserType,_std::allocator<aliyun::RamListUsersUserType>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            resp_5.users.
            super__Vector_base<aliyun::RamListUsersUserType,_std::allocator<aliyun::RamListUsersUserType>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&req,"cn-hangzhou",(allocator<char> *)&local_128);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&req_2,"my_appid",(allocator<char> *)&local_108);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_148,"my_secret",(allocator<char> *)&resp);
            this = (RamPutUserPolicyRequestType *)
                   aliyun::Ram::CreateRamClient(&req,&req_2,local_148);
            std::__cxx11::string::~string(local_148);
            std::__cxx11::string::~string((string *)&req_2);
            std::__cxx11::string::~string((string *)&req);
            if (this == (RamPutUserPolicyRequestType *)0x0) {
              std::
              vector<aliyun::RamListUsersUserType,_std::allocator<aliyun::RamListUsersUserType>_>::
              ~vector(&resp_5.users);
              req.user_name._M_string_length = 0;
              req.user_name.field_2._M_local_buf[0] = '\0';
              req.comments._M_string_length = 0;
              req.comments.field_2._M_local_buf[0] = '\0';
              local_40 = 0;
              local_38._M_local_buf[0] = '\0';
              req.user_name._M_dataplus._M_p = (pointer)paVar1;
              req.comments._M_dataplus._M_p = (pointer)paVar2;
              local_48._M_p = (pointer)&local_38;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&req_2,"cn-hangzhou",(allocator<char> *)&local_108);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_148,"my_appid",(allocator<char> *)&resp_5);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_128,"my_secret",&local_169);
              this = (RamPutUserPolicyRequestType *)
                     aliyun::Ram::CreateRamClient(&req_2,local_148,&local_128);
              std::__cxx11::string::~string((string *)&local_128);
              std::__cxx11::string::~string(local_148);
              std::__cxx11::string::~string((string *)&req_2);
              if (this == (RamPutUserPolicyRequestType *)0x0) {
                aliyun::RamPutUserPolicyRequestType::~RamPutUserPolicyRequestType
                          ((RamPutUserPolicyRequestType *)&req);
                req.user_name._M_string_length = 0;
                req.user_name.field_2._M_local_buf[0] = '\0';
                req.user_name._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_2,"cn-hangzhou",(allocator<char> *)&local_108);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_148,"my_appid",(allocator<char> *)&resp_5);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_128,"my_secret",&local_169);
                this = (RamPutUserPolicyRequestType *)
                       aliyun::Ram::CreateRamClient(&req_2,local_148,&local_128);
                std::__cxx11::string::~string((string *)&local_128);
                std::__cxx11::string::~string(local_148);
                std::__cxx11::string::~string((string *)&req_2);
                if (this == (RamPutUserPolicyRequestType *)0x0) {
                  std::__cxx11::string::~string((string *)&req);
                  return 0;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_108,"127.0.0.1:12234",(allocator<char> *)&resp_5);
                aliyun::Ram::SetProxyHost((Ram *)this,&local_108);
                std::__cxx11::string::~string((string *)&local_108);
                if ((char)(this->policy_name)._M_string_length == '\x01') {
                  *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
                }
                this_00 = (HttpTestListener *)operator_new(0x180);
                HttpTestListener::HttpTestListener(this_00,0x2fca);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&resp_5,"{}",&local_169);
                HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
                std::__cxx11::string::~string((string *)&resp_5);
                HttpTestListener::Start(this_00);
                std::__cxx11::string::assign((char *)&req);
                aliyun::Ram::RemoveUser
                          ((RamRemoveUserRequestType *)this,(RamRemoveUserResponseType *)&req,
                           (RamErrorInfo *)&resp);
                HttpTestListener::WaitComplete(this_00);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_108,"127.0.0.1:12234",(allocator<char> *)&resp_5);
                aliyun::Ram::SetProxyHost((Ram *)this,&local_108);
                std::__cxx11::string::~string((string *)&local_108);
                if ((char)(this->policy_name)._M_string_length == '\x01') {
                  *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
                }
                this_00 = (HttpTestListener *)operator_new(0x180);
                HttpTestListener::HttpTestListener(this_00,0x2fca);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&resp_5,"{}",&local_169);
                HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
                std::__cxx11::string::~string((string *)&resp_5);
                HttpTestListener::Start(this_00);
                std::__cxx11::string::assign((char *)&req);
                std::__cxx11::string::assign((char *)&req.comments);
                std::__cxx11::string::assign((char *)&local_48);
                aliyun::Ram::PutUserPolicy
                          (this,(RamPutUserPolicyResponseType *)&req,(RamErrorInfo *)&resp);
                HttpTestListener::WaitComplete(this_00);
              }
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_128,"127.0.0.1:12234",(allocator<char> *)&local_108);
              aliyun::Ram::SetProxyHost((Ram *)this,&local_128);
              std::__cxx11::string::~string((string *)&local_128);
              if ((char)(this->policy_name)._M_string_length == '\x01') {
                *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
              }
              this_00 = (HttpTestListener *)operator_new(0x180);
              HttpTestListener::HttpTestListener(this_00,0x2fca);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_108,
                         "{  \"Users\": {    \"User\": [      {        \"UserName\": \"UserName\",        \"Comments\": \"Comments\"      }    ]  }}"
                         ,(allocator<char> *)&resp);
              HttpTestListener::SetResponseBody(this_00,&local_108);
              std::__cxx11::string::~string((string *)&local_108);
              HttpTestListener::Start(this_00);
              aliyun::Ram::ListUsers((RamListUsersResponseType *)this,(RamErrorInfo *)&resp_5);
              HttpTestListener::WaitComplete(this_00);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_108,"127.0.0.1:12234",(allocator<char> *)&resp_5);
            aliyun::Ram::SetProxyHost((Ram *)this,&local_108);
            std::__cxx11::string::~string((string *)&local_108);
            if ((char)(this->policy_name)._M_string_length == '\x01') {
              *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
            }
            this_00 = (HttpTestListener *)operator_new(0x180);
            HttpTestListener::HttpTestListener(this_00,0x2fca);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&resp_5,
                       "{  \"Policies\": {    \"Policy\": [      \"Policy\"    ]  }}",&local_169);
            HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
            std::__cxx11::string::~string((string *)&resp_5);
            HttpTestListener::Start(this_00);
            std::__cxx11::string::assign((char *)&req);
            aliyun::Ram::ListUserPolicies
                      ((RamListUserPoliciesRequestType *)this,
                       (RamListUserPoliciesResponseType *)&req,(RamErrorInfo *)&resp);
            HttpTestListener::WaitComplete(this_00);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&resp_5,"127.0.0.1:12234",(allocator<char> *)&resp);
          aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_5);
          std::__cxx11::string::~string((string *)&resp_5);
          if ((char)(this->policy_name)._M_string_length == '\x01') {
            *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
          }
          this_00 = (HttpTestListener *)operator_new(0x180);
          HttpTestListener::HttpTestListener(this_00,0x2fca);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&resp,
                     "{  \"UserName\": \"UserName\",  \"PolicyName\": \"PolicyName\",  \"PolicyDocument\": \"PolicyDocument\"}"
                     ,&local_169);
          HttpTestListener::SetResponseBody(this_00,(string *)&resp);
          std::__cxx11::string::~string((string *)&resp);
          HttpTestListener::Start(this_00);
          std::__cxx11::string::assign((char *)&req_2);
          std::__cxx11::string::assign((char *)&local_a8);
          aliyun::Ram::GetUserPolicy
                    ((RamGetUserPolicyRequestType *)this,(RamGetUserPolicyResponseType *)&req_2,
                     (RamErrorInfo *)&req);
          HttpTestListener::WaitComplete(this_00);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resp_5,"127.0.0.1:12234",(allocator<char> *)&resp);
        aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_5);
        std::__cxx11::string::~string((string *)&resp_5);
        if ((char)(this->policy_name)._M_string_length == '\x01') {
          *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
        }
        this_00 = (HttpTestListener *)operator_new(0x180);
        HttpTestListener::HttpTestListener(this_00,0x2fca);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resp,"{  \"UserName\": \"UserName\",  \"Comments\": \"Comments\"}",
                   &local_169);
        HttpTestListener::SetResponseBody(this_00,(string *)&resp);
        std::__cxx11::string::~string((string *)&resp);
        HttpTestListener::Start(this_00);
        std::__cxx11::string::assign((char *)&req_2);
        aliyun::Ram::GetUser
                  ((RamGetUserRequestType *)this,(RamGetUserResponseType *)&req_2,
                   (RamErrorInfo *)&req);
        HttpTestListener::WaitComplete(this_00);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"127.0.0.1:12234",(allocator<char> *)&resp_5);
      aliyun::Ram::SetProxyHost((Ram *)this,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      if ((char)(this->policy_name)._M_string_length == '\x01') {
        *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
      }
      this_00 = (HttpTestListener *)operator_new(0x180);
      HttpTestListener::HttpTestListener(this_00,0x2fca);
      std::__cxx11::string::string<std::allocator<char>>((string *)&resp_5,"{}",&local_169);
      HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
      std::__cxx11::string::~string((string *)&resp_5);
      HttpTestListener::Start(this_00);
      std::__cxx11::string::assign((char *)&req);
      std::__cxx11::string::assign((char *)&req.comments);
      aliyun::Ram::DeleteUserPolicy
                ((RamDeleteUserPolicyRequestType *)this,(RamDeleteUserPolicyResponseType *)&req,
                 (RamErrorInfo *)&resp);
      HttpTestListener::WaitComplete(this_00);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"127.0.0.1:12234",(allocator<char> *)&resp_5);
    aliyun::Ram::SetProxyHost((Ram *)this,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    if ((char)(this->policy_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->policy_name)._M_string_length + 1) = 0;
    }
    this_00 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(this_00,0x2fca);
    std::__cxx11::string::string<std::allocator<char>>((string *)&resp_5,"{}",&local_169);
    HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
    std::__cxx11::string::~string((string *)&resp_5);
    HttpTestListener::Start(this_00);
    std::__cxx11::string::assign((char *)&req);
    std::__cxx11::string::assign((char *)&req.comments);
    aliyun::Ram::AddUser
              ((RamAddUserRequestType *)this,(RamAddUserResponseType *)&req,(RamErrorInfo *)&resp);
    HttpTestListener::WaitComplete(this_00);
  }
  HttpTestListener::~HttpTestListener(this_00);
  operator_delete(this_00,0x180);
  aliyun::Ram::~Ram((Ram *)this);
  operator_delete(this,0x38);
  aliyun::RamPutUserPolicyRequestType::~RamPutUserPolicyRequestType
            ((RamPutUserPolicyRequestType *)&req);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_add_user();
  test_delete_user_policy();
  test_get_user();
  test_get_user_policy();
  test_list_user_policies();
  test_list_users();
  test_put_user_policy();
  test_remove_user();
}